

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.hh
# Opt level: O0

void __thiscall Pipeline::~Pipeline(Pipeline *this)

{
  code *pcVar1;
  Pipeline *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Pipeline() = default;